

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  bool bVar2;
  TargetType TVar3;
  cmMakefileTargetGenerator *tg;
  _Alloc_hider _Var4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_41;
  string local_40;
  
  cmLocalCommonGenerator::SetConfigName(&this->super_cmLocalCommonGenerator);
  bVar2 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string((string *)&local_40,"CMAKE_COLOR_MAKEFILE",&local_41);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
    this->ColorMakefile = bVar2;
    std::__cxx11::string::~string((string *)&local_40);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",&local_41)
  ;
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  this->SkipPreprocessedSourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",&local_41);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  this->SkipAssemblySourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_40,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  this_00 = (cmGlobalUnixMakefileGenerator3 *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  for (_Var4._M_p = local_40._M_dataplus._M_p; _Var4._M_p != (pointer)local_40._M_string_length;
      _Var4._M_p = _Var4._M_p + 8) {
    TVar3 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var4._M_p);
    if (TVar3 != INTERFACE_LIBRARY) {
      tg = cmMakefileTargetGenerator::New(*(cmGeneratorTarget **)_Var4._M_p);
      if (tg != (cmMakefileTargetGenerator *)0x0) {
        (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(tg);
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,tg);
        (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(tg);
      }
    }
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_40);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  this->SetConfigName();

  // Record whether some options are enabled to avoid checking many
  // times later.
  if(!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile())
    {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
    }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for(std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
      t != targets.end(); ++t)
    {
    if ((*t)->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    cmsys::auto_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(*t));
    if (tg.get())
      {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
      }
    }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}